

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O2

void __thiscall
burst::
intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
::faze(intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
       *this)

{
  _List_node_base *p_Var1;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  *poVar2;
  type_conflict3 tVar3;
  reference piVar4;
  reference piVar5;
  outer_range_iterator range;
  outer_range_iterator max_range;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_78;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_60;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_48;
  
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  ::owning_iterator(&max_range,&this->m_begin);
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  ::owning_iterator(&range,&this->m_begin);
  do {
    tVar3 = boost::iterators::operator!=
                      ((iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long>
                        *)&range,
                       (iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long>
                        *)&this->m_end);
    if (!tVar3) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&range.m_container.
                  super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
      ::owning_iterator(&local_60,&max_range);
      owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
      ::owning_iterator(&local_78,&this->m_end);
      std::
      prev<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>>,std::allocator<boost::iterator_range<std::_List_const_iterator<int>>>>>>
                (&local_48,&local_78,1);
      poVar2 = &local_60;
      range.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                ((local_60.m_iterator._M_current)->
                super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                ).
                super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                .m_Begin._M_node;
      range.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((local_60.m_iterator._M_current)->
           super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
           ).
           super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
           .m_End._M_node;
      p_Var1 = ((local_48.m_iterator._M_current)->
               super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
               ).
               super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               .m_End._M_node;
      ((local_60.m_iterator._M_current)->
      super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
      ).
      super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin._M_node =
           ((local_48.m_iterator._M_current)->
           super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
           ).
           super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
           .m_Begin._M_node;
      ((local_60.m_iterator._M_current)->
      super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
      ).
      super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
      .m_End._M_node = p_Var1;
      ((local_48.m_iterator._M_current)->
      super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
      ).
      super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin._M_node =
           (_List_node_base *)
           range.m_container.
           super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      ((local_48.m_iterator._M_current)->
      super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
      ).
      super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
      .m_End._M_node =
           (_List_node_base *)
           range.m_container.
           super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_48.m_container.
                  super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_78.m_container.
                  super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
LAB_001f5478:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(poVar2->m_container).
                  super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&max_range.m_container.
                  super___shared_ptr<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return;
    }
    std::__advance<std::_List_const_iterator<int>,long>(range.m_iterator._M_current,1);
    if (((range.m_iterator._M_current)->
        super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
        ).
        super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_node ==
        ((range.m_iterator._M_current)->
        super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
        ).
        super_iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        .m_End._M_node) {
      scroll_to_end(this);
      poVar2 = (owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
                *)&range.m_container;
      goto LAB_001f5478;
    }
    piVar4 = boost::iterator_range_detail::
             iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
             ::front((iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                      *)max_range.m_iterator._M_current);
    piVar5 = boost::iterator_range_detail::
             iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
             ::front((iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                      *)range.m_iterator._M_current);
    if (*piVar5 < *piVar4) {
      owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
      ::operator=(&max_range,&range);
    }
    range.m_iterator._M_current = range.m_iterator._M_current + 1;
  } while( true );
}

Assistant:

void faze ()
        {
            auto max_range = m_begin;
            for (auto range = m_begin; range != m_end; ++range)
            {
                range->advance_begin(1);
                if (range->empty())
                {
                    scroll_to_end();
                    return;
                }
                else if (m_compare(max_range->front(), range->front()))
                {
                    max_range = range;
                }
            }
            std::iter_swap(max_range, std::prev(m_end));
        }